

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

token * __thiscall libchars::commands::find_pval(commands *this,token *position)

{
  token **pptVar1;
  token *ptVar2;
  
  if (this->cmd == (command *)0x0) {
    return (token *)0x0;
  }
  pptVar1 = &position->next;
  if (position == (token *)0x0) {
    pptVar1 = &this->t_par;
  }
  ptVar2 = *pptVar1;
  while( true ) {
    if (ptVar2 == (token *)0x0) {
      return (token *)0x0;
    }
    if (ptVar2->ttype == VALUE) break;
    ptVar2 = ptVar2->next;
  }
  return ptVar2;
}

Assistant:

token *commands::find_pval(token *position)
    {
        if (cmd == NULL)
            return NULL;

        token *T = (position == NULL) ? t_par : position->next;
        while (T != NULL && T->ttype != token::VALUE)
            T = T->next;

        return T;
    }